

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O0

int read_setting_i(settings_r *handle,char *key,int defvalue)

{
  void *pvVar1;
  skeyval *kv;
  skeyval tmp;
  char *val;
  int defvalue_local;
  char *key_local;
  settings_r *handle_local;
  
  kv = (skeyval *)key;
  if ((handle == (settings_r *)0x0) ||
     (pvVar1 = find234(handle->t,&kv,(cmpfn234)0x0), pvVar1 == (void *)0x0)) {
    tmp.value = get_setting(key);
  }
  else {
    tmp.value = *(char **)((long)pvVar1 + 8);
    if (tmp.value == (char *)0x0) {
      __assert_fail("val != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/storage.c"
                    ,0x1bd,"int read_setting_i(settings_r *, const char *, int)");
    }
  }
  handle_local._4_4_ = defvalue;
  if (tmp.value != (char *)0x0) {
    handle_local._4_4_ = atoi(tmp.value);
  }
  return handle_local._4_4_;
}

Assistant:

int read_setting_i(settings_r *handle, const char *key, int defvalue)
{
    const char *val;
    struct skeyval tmp, *kv;

    tmp.key = key;
    if (handle != NULL &&
        (kv = find234(handle->t, &tmp, NULL)) != NULL) {
        val = kv->value;
        assert(val != NULL);
    } else
        val = get_setting(key);

    if (!val)
        return defvalue;
    else
        return atoi(val);
}